

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeMRRC2(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint uVar2;
  uint uVar3;
  
  DVar1 = MCDisassembler_Fail;
  if ((Val & 0xe00) != 0xa00) {
    uVar2 = Val >> 0x10 & 0xf;
    uVar3 = Val >> 0xc & 0xf;
    MCOperand_CreateImm0(Inst,(ulong)(Val >> 8 & 0xf));
    MCOperand_CreateImm0(Inst,(ulong)(Val >> 4 & 0xf));
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar3]);
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar2]);
    DVar1 = (uint)(uVar3 != uVar2) * 2 | MCDisassembler_SoftFail;
    if (uVar3 == 0xf) {
      DVar1 = MCDisassembler_SoftFail;
    }
    if (uVar2 == 0xf) {
      DVar1 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)(Val & 0xf));
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeMRRC2(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{

	DecodeStatus S = MCDisassembler_Success;

	unsigned CRm = fieldFromInstruction_4(Val, 0, 4);
	unsigned opc1 = fieldFromInstruction_4(Val, 4, 4);
	unsigned cop = fieldFromInstruction_4(Val, 8, 4);
	unsigned Rt = fieldFromInstruction_4(Val, 12, 4);
	unsigned Rt2 = fieldFromInstruction_4(Val, 16, 4);

	if ((cop & ~0x1) == 0xa)
		return MCDisassembler_Fail;

	if (Rt == Rt2)
		S = MCDisassembler_SoftFail;

	MCOperand_CreateImm0(Inst, cop);
	MCOperand_CreateImm0(Inst, opc1);
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt2, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, CRm);

	return S;
}